

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

size_t __thiscall leveldb::Arena::MemoryUsage(Arena *this)

{
  Arena *this_local;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return (this->memory_usage_).super___atomic_base<unsigned_long>._M_i;
}

Assistant:

size_t MemoryUsage() const {
    return memory_usage_.load(std::memory_order_relaxed);
  }